

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_quaddrawer.cpp
# Opt level: O3

void __thiscall FQuadDrawer::DoRender(FQuadDrawer *this,int type)

{
  FShader *pFVar1;
  float *pfVar2;
  long lVar3;
  float matV [16];
  float matT [16];
  GLfloat local_98 [2];
  float afStack_90 [14];
  GLfloat local_58 [2];
  undefined8 auStack_50 [7];
  
  pfVar2 = &buffer[0].u;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)local_98 + lVar3) = *(undefined8 *)(pfVar2 + -3);
    *(float *)((long)afStack_90 + lVar3) = pfVar2[-1];
    *(undefined4 *)((long)afStack_90 + lVar3 + 4) = 0x3f800000;
    *(undefined8 *)((long)local_58 + lVar3) = *(undefined8 *)pfVar2;
    *(undefined8 *)((long)local_58 + lVar3 + 8) = 0;
    pfVar2 = pfVar2 + 5;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  pFVar1 = GLRenderer->mShaderManager->mActiveShader;
  (*_ptrc_glUniformMatrix4fv)(pFVar1->vertexmatrix_index,1,'\0',local_98);
  (*_ptrc_glUniformMatrix4fv)(pFVar1->texcoordmatrix_index,1,'\0',local_58);
  (*_ptrc_glUniform1i)(pFVar1->quadmode_index,1);
  (*_ptrc_glDrawArrays)(type,0,4);
  (*_ptrc_glUniform1i)(pFVar1->quadmode_index,0);
  return;
}

Assistant:

void FQuadDrawer::DoRender(int type)
{
	// When this gets called, the render state must already be applied so we can just
	// send our vertices to the current shader.
	float matV[16], matT[16];
	
	for(int i=0;i<4;i++)
	{
		matV[i*4+0] = buffer[i].x;
		matV[i*4+1] = buffer[i].z;
		matV[i*4+2] = buffer[i].y;
		matV[i*4+3] = 1;
		matT[i*4+0] = buffer[i].u;
		matT[i*4+1] = buffer[i].v;
		matT[i*4+2] = matT[i*4+3] = 0;
	}
	FShader *shader = GLRenderer->mShaderManager->GetActiveShader();
	glUniformMatrix4fv(shader->vertexmatrix_index, 1, false, matV);
	glUniformMatrix4fv(shader->texcoordmatrix_index, 1, false, matT);
	glUniform1i(shader->quadmode_index, 1);
	GLRenderer->mVBO->RenderArray(type, FFlatVertexBuffer::QUAD_INDEX, 4);
	glUniform1i(shader->quadmode_index, 0);
}